

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndelLengthDistribution.cpp
# Opt level: O1

ostream * operator<<(ostream *os,IndelLengthDistribution *ild)

{
  void *__src;
  long lVar1;
  size_type __n;
  int *__dest;
  int *extraout_RDX;
  void *__src_00;
  ulong uVar2;
  size_t sVar3;
  void *__dest_00;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_21,1);
  if ((ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_22,1);
      }
      std::ostream::operator<<
                ((ostream *)os,
                 (ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ild->phred_costs).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  __src_00 = (void *)0x5d;
  std::operator<<(os,']');
  __n = std::vector<int,_std::allocator<int>_>::_M_check_len
                  ((vector<int,_std::allocator<int>_> *)os,1,"vector::_M_realloc_insert");
  __src = *(void **)os;
  lVar1 = *(long *)((new_allocator<int> *)os + 8);
  sVar3 = (long)__src_00 - (long)__src;
  if (__n == 0) {
    __dest = (int *)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)os,__n,(void *)0x0);
  }
  __dest[(long)sVar3 >> 2] = *extraout_RDX;
  if (0 < (long)sVar3) {
    memmove(__dest,__src,sVar3);
  }
  __dest_00 = (void *)((long)__dest + sVar3 + 4);
  sVar3 = lVar1 - (long)__src_00;
  if (0 < (long)sVar3) {
    memmove(__dest_00,__src_00,sVar3);
  }
  if (__src != (void *)0x0) {
    operator_delete(__src);
  }
  *(int **)os = __dest;
  *(size_t *)((new_allocator<int> *)os + 8) = (long)__dest_00 + sVar3;
  *(ostream **)((new_allocator<int> *)os + 0x10) = (ostream *)(__dest + __n);
  return (ostream *)(__dest + __n);
}

Assistant:

std::ostream& operator<<(std::ostream& os, const IndelLengthDistribution& ild) {
	os << '[';
	for (size_t i=0; i<ild.phred_costs.size(); ++i) {
		if (i>0) os << ',';
		os << ild.phred_costs[i];
	}
	os << ']';
}